

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall embree::SceneGraph::HairSetNode::resetInDegree(HairSetNode *this)

{
  size_t sVar1;
  
  (this->super_Node).closed = false;
  sVar1 = (this->super_Node).indegree;
  if (sVar1 == 1) {
    (*(((this->material).ptr)->super_Node).super_RefCount._vptr_RefCount[8])();
    sVar1 = (this->super_Node).indegree;
  }
  (this->super_Node).indegree = sVar1 - 1;
  return;
}

Assistant:

void SceneGraph::HairSetNode::resetInDegree()
  {
    closed = false;
    if (indegree == 1)
      material->resetInDegree();
    indegree--;
  }